

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O0

void __thiscall TCLAP::StdOutput::_longUsage(StdOutput *this,CmdLineInterface *_cmd,ostream *os)

{
  Arg *pAVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  *__x;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference ppAVar8;
  ostream *this_00;
  reference ppAVar9;
  undefined1 local_1e8 [40];
  string local_1c0 [32];
  string local_1a0 [32];
  iterator local_180;
  _List_const_iterator<TCLAP::Arg_*> local_178;
  iterator local_170;
  _List_const_iterator<TCLAP::Arg_*> local_168;
  ArgListIterator it_1;
  allocator local_151;
  string local_150 [32];
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_130;
  __normal_iterator<TCLAP::Arg_*const_*,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_128;
  undefined1 local_120 [40];
  string local_f8 [32];
  string local_d8 [32];
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_b8;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_b0;
  __normal_iterator<TCLAP::Arg_*const_*,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_a8;
  ArgVectorIterator it;
  undefined1 local_98 [4];
  int i;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  xorList;
  XorHandler xorHandler;
  string local_58 [8];
  string message;
  undefined1 local_38 [8];
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> argList;
  ostream *os_local;
  CmdLineInterface *_cmd_local;
  StdOutput *this_local;
  
  argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node._M_size =
       (size_t)os;
  iVar4 = (*_cmd->_vptr_CmdLineInterface[0xb])();
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38,
             (list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)CONCAT44(extraout_var,iVar4));
  iVar4 = (*_cmd->_vptr_CmdLineInterface[0xe])();
  std::__cxx11::string::string(local_58,(string *)CONCAT44(extraout_var_00,iVar4));
  iVar4 = (*_cmd->_vptr_CmdLineInterface[0xc])();
  XorHandler::XorHandler
            ((XorHandler *)
             &xorList.
              super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (XorHandler *)CONCAT44(extraout_var_01,iVar4));
  __x = XorHandler::getXorList
                  ((XorHandler *)
                   &xorList.
                    super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            *)local_98,__x);
  for (it._M_current._4_4_ = 0; uVar5 = (ulong)it._M_current._4_4_,
      sVar6 = std::
              vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ::size((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                      *)local_98), uVar5 < sVar6; it._M_current._4_4_ = it._M_current._4_4_ + 1) {
    pvVar7 = std::
             vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ::operator[]((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                           *)local_98,(long)(int)it._M_current._4_4_);
    local_b0._M_current =
         (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(pvVar7);
    __gnu_cxx::
    __normal_iterator<TCLAP::Arg*const*,std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>::
    __normal_iterator<TCLAP::Arg**>
              ((__normal_iterator<TCLAP::Arg*const*,std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>
                *)&local_a8,&local_b0);
    while( true ) {
      pvVar7 = std::
               vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
               ::operator[]((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                             *)local_98,(long)(int)it._M_current._4_4_);
      local_b8._M_current =
           (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(pvVar7);
      bVar3 = __gnu_cxx::operator!=(&local_a8,&local_b8);
      sVar2 = argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
              _M_size;
      if (!bVar3) break;
      ppAVar8 = __gnu_cxx::
                __normal_iterator<TCLAP::Arg_*const_*,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                ::operator*(&local_a8);
      pAVar1 = *ppAVar8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"val",(allocator *)(local_120 + 0x27));
      (*pAVar1->_vptr_Arg[9])(local_d8,pAVar1,local_f8);
      spacePrint(this,(ostream *)sVar2,local_d8,0x4b,3,3);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)(local_120 + 0x27));
      sVar2 = argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
              _M_size;
      __gnu_cxx::
      __normal_iterator<TCLAP::Arg_*const_*,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
      ::operator*(&local_a8);
      Arg::getDescription_abi_cxx11_((Arg *)local_120);
      spacePrint(this,(ostream *)sVar2,(string *)local_120,0x4b,5,0);
      std::__cxx11::string::~string((string *)local_120);
      local_128 = __gnu_cxx::
                  __normal_iterator<TCLAP::Arg_*const_*,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                  ::operator+(&local_a8,1);
      pvVar7 = std::
               vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
               ::operator[]((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                             *)local_98,(long)(int)it._M_current._4_4_);
      local_130._M_current =
           (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(pvVar7);
      bVar3 = __gnu_cxx::operator!=(&local_128,&local_130);
      sVar2 = argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
              _M_size;
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_150,"-- OR --",&local_151);
        spacePrint(this,(ostream *)sVar2,(string *)local_150,0x4b,9,0);
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
      }
      it_1._M_node = (_List_node_base *)
                     __gnu_cxx::
                     __normal_iterator<TCLAP::Arg_*const_*,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                     ::operator++(&local_a8,0);
    }
    this_00 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)
                         argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>.
                         _M_impl._M_node._M_size,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  local_170._M_node =
       (_List_node_base *)
       std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                 ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38);
  std::_List_const_iterator<TCLAP::Arg_*>::_List_const_iterator(&local_168,&local_170);
  while( true ) {
    local_180._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                   ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38);
    std::_List_const_iterator<TCLAP::Arg_*>::_List_const_iterator(&local_178,&local_180);
    bVar3 = std::operator!=(&local_168,&local_178);
    if (!bVar3) break;
    ppAVar9 = std::_List_const_iterator<TCLAP::Arg_*>::operator*(&local_168);
    bVar3 = XorHandler::contains
                      ((XorHandler *)
                       &xorList.
                        super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppAVar9);
    sVar2 = argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
            _M_size;
    if (!bVar3) {
      ppAVar9 = std::_List_const_iterator<TCLAP::Arg_*>::operator*(&local_168);
      pAVar1 = *ppAVar9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c0,"val",(allocator *)(local_1e8 + 0x27));
      (*pAVar1->_vptr_Arg[9])(local_1a0,pAVar1,local_1c0);
      spacePrint(this,(ostream *)sVar2,local_1a0,0x4b,3,3);
      std::__cxx11::string::~string((string *)local_1a0);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)(local_1e8 + 0x27));
      sVar2 = argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
              _M_size;
      std::_List_const_iterator<TCLAP::Arg_*>::operator*(&local_168);
      Arg::getDescription_abi_cxx11_((Arg *)local_1e8);
      spacePrint(this,(ostream *)sVar2,(string *)local_1e8,0x4b,5,0);
      std::__cxx11::string::~string((string *)local_1e8);
      std::ostream::operator<<
                ((ostream *)
                 argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                 _M_node._M_size,std::endl<char,std::char_traits<char>>);
    }
    std::_List_const_iterator<TCLAP::Arg_*>::operator++(&local_168,0);
  }
  std::ostream::operator<<
            ((ostream *)
             argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
             _M_size,std::endl<char,std::char_traits<char>>);
  spacePrint(this,(ostream *)
                  argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                  _M_node._M_size,(string *)local_58,0x4b,3,0);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             *)local_98);
  XorHandler::~XorHandler
            ((XorHandler *)
             &xorList.
              super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::~list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38);
  return;
}

Assistant:

inline void 
StdOutput::_longUsage( CmdLineInterface& _cmd, 
					   std::ostream& os ) const
{
	std::list<Arg*> argList = _cmd.getArgList();
	std::string message = _cmd.getMessage();
	XorHandler xorHandler = _cmd.getXorHandler();
	std::vector< std::vector<Arg*> > xorList = xorHandler.getXorList();

	// first the xor 
	for ( int i = 0; static_cast<unsigned int>(i) < xorList.size(); i++ )
		{
			for ( ArgVectorIterator it = xorList[i].begin(); 
				  it != xorList[i].end(); 
				  it++ )
				{
					spacePrint( os, (*it)->longID(), 75, 3, 3 );
					spacePrint( os, (*it)->getDescription(), 75, 5, 0 );

					if ( it+1 != xorList[i].end() )
						spacePrint(os, "-- OR --", 75, 9, 0);
				}
			os << std::endl << std::endl;
		}

	// then the rest
	for (ArgListIterator it = argList.begin(); it != argList.end(); it++)
		if ( !xorHandler.contains( (*it) ) )
			{
				spacePrint( os, (*it)->longID(), 75, 3, 3 ); 
				spacePrint( os, (*it)->getDescription(), 75, 5, 0 ); 
				os << std::endl;
			}

	os << std::endl;

	spacePrint( os, message, 75, 3, 0 );
}